

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_MonitoredItem * UA_MonitoredItem_new(void)

{
  UA_MonitoredItem *new;
  
  new = (UA_MonitoredItem *)malloc(0xa8);
  if (new == (UA_MonitoredItem *)0x0) {
    new = (UA_MonitoredItem *)0x0;
  }
  else {
    new->subscription = (UA_Subscription *)0x0;
    new->currentQueueSize = 0;
    new->maxQueueSize = 0;
    new->monitoredItemType = UA_MONITOREDITEMTYPE_CHANGENOTIFY;
    new->timestampsToReturn = UA_TIMESTAMPSTORETURN_SOURCE;
    UA_String_init(&new->indexRange);
    (new->queue).tqh_first = (MonitoredItem_queuedValue *)0x0;
    (new->queue).tqh_last = &(new->queue).tqh_first;
    UA_NodeId_init(&new->monitoredNodeId);
    (new->lastSampledValue).length = 0;
    (new->lastSampledValue).data = (UA_Byte *)0x0;
    memset(&new->sampleJobGuid,0,0x10);
    new->sampleJobIsRegistered = false;
    new->itemId = 0;
  }
  return new;
}

Assistant:

UA_MonitoredItem * UA_MonitoredItem_new() {
    UA_MonitoredItem *new = UA_malloc(sizeof(UA_MonitoredItem));
    if(!new)
        return NULL;
    new->subscription = NULL;
    new->currentQueueSize = 0;
    new->maxQueueSize = 0;
    new->monitoredItemType = UA_MONITOREDITEMTYPE_CHANGENOTIFY; /* currently hardcoded */
    new->timestampsToReturn = UA_TIMESTAMPSTORETURN_SOURCE;
    UA_String_init(&new->indexRange);
    TAILQ_INIT(&new->queue);
    UA_NodeId_init(&new->monitoredNodeId);
    new->lastSampledValue = UA_BYTESTRING_NULL;
    memset(&new->sampleJobGuid, 0, sizeof(UA_Guid));
    new->sampleJobIsRegistered = false;
    new->itemId = 0;
    return new;
}